

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

int binbuf_read_via_path(_binbuf *b,char *filename,char *dirname,int crflag)

{
  int iVar1;
  char *bufptr;
  char buf [1000];
  char *local_410;
  char local_408 [1008];
  
  iVar1 = open_via_path(dirname,filename,"",local_408,&local_410,1000,0);
  if (iVar1 < 0) {
    pd_error((void *)0x0,"%s: can\'t open",filename);
    iVar1 = 1;
  }
  else {
    close(iVar1);
    iVar1 = binbuf_read(b,local_410,local_408,crflag);
  }
  return iVar1;
}

Assistant:

int binbuf_read_via_path(t_binbuf *b, const char *filename, const char *dirname,
    int crflag)
{
    int filedesc;
    char buf[MAXPDSTRING], *bufptr;
    if ((filedesc = open_via_path(
        dirname, filename, "", buf, &bufptr, MAXPDSTRING, 0)) < 0)
    {
        pd_error(0, "%s: can't open", filename);
        return (1);
    }
    else close (filedesc);
    if (binbuf_read(b, bufptr, buf, crflag))
        return (1);
    else return (0);
}